

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_uint64 ma_dr_wav__metadata_process_chunk
                    (ma_dr_wav__metadata_parser *pParser,ma_dr_wav_chunk_header *pChunkHeader,
                    ma_dr_wav_metadata_type allowedMetadataTypes)

{
  ma_dr_wav_metadata_location location;
  ma_uint8 amVar1 [4];
  ma_bool32 mVar2;
  uint uVar3;
  ma_uint32 mVar4;
  size_t bytesRead;
  size_t sVar5;
  size_t sVar6;
  ma_uint64 mVar7;
  char *pcVar8;
  size_t sVar9;
  size_t sVar10;
  ma_dr_wav_metadata_type type;
  ulong uVar11;
  ma_dr_wav_metadata *pmVar12;
  long lVar13;
  ma_dr_wav_smpl_loop *pmVar14;
  ma_uint8 *pmVar15;
  ma_uint32 iCuePoint;
  size_t bytesRead_1;
  ma_uint64 mVar16;
  ma_uint8 cueHeaderSectionData [4];
  undefined4 uStack_2b4;
  undefined4 local_2b0;
  undefined4 uStack_2ac;
  undefined4 local_2a8;
  undefined4 uStack_2a4;
  ma_uint8 subchunkSizeBuffer [4];
  ma_uint8 smplHeaderData [36];
  char local_198 [32];
  char local_178 [32];
  char *local_158;
  undefined2 local_150;
  undefined8 local_14e;
  ma_uint8 *local_146;
  
  mVar2 = ma_dr_wav_fourcc_equal((ma_uint8 *)pChunkHeader,"smpl");
  if (mVar2 == 0) {
    mVar2 = ma_dr_wav_fourcc_equal((ma_uint8 *)pChunkHeader,"inst");
    if (mVar2 == 0) {
      mVar2 = ma_dr_wav_fourcc_equal((ma_uint8 *)pChunkHeader,"acid");
      if (mVar2 == 0) {
        mVar2 = ma_dr_wav_fourcc_equal((ma_uint8 *)pChunkHeader,"cue ");
        if (mVar2 == 0) {
          mVar2 = ma_dr_wav_fourcc_equal((ma_uint8 *)pChunkHeader,"bext");
          if (mVar2 != 0) {
            uVar11 = pChunkHeader->sizeInBytes;
            if (uVar11 < 0x25a) {
              return 0;
            }
            if (pParser->stage != ma_dr_wav__metadata_parser_stage_count) {
              pmVar12 = pParser->pMetadata + pParser->metadataCursor;
              sVar5 = (*pParser->onRead)(pParser->pReadSeekUserData,smplHeaderData,0x25a);
              if (sVar5 == 0x25a) {
                pmVar12->type = ma_dr_wav_metadata_type_bext;
                _cueHeaderSectionData = smplHeaderData;
                pcVar8 = ma_dr_wav__metadata_copy_string(pParser,(char *)smplHeaderData,0x100);
                (pmVar12->data).bext.pDescription = pcVar8;
                pcVar8 = ma_dr_wav__metadata_copy_string(pParser,local_198,0x20);
                (pmVar12->data).bext.pOriginatorName = pcVar8;
                pcVar8 = ma_dr_wav__metadata_copy_string(pParser,local_178,0x20);
                (pmVar12->data).bext.pOriginatorReference = pcVar8;
                (pmVar12->data).labelledCueRegion.pString = local_158;
                *(undefined2 *)((long)&pmVar12->data + 0x20) = local_150;
                *(undefined8 *)((long)&pmVar12->data + 0x22) = local_14e;
                (pmVar12->data).smpl.pSamplerSpecificData = local_146;
                ma_dr_wav_buffer_reader_read_u16
                          ((ma_dr_wav_buffer_reader *)cueHeaderSectionData,
                           &(pmVar12->data).bext.version);
                pmVar15 = pParser->pDataCursor;
                pParser->pDataCursor = pmVar15 + 0x40;
                (pmVar12->data).bext.pUMID = pmVar15;
                if (pmVar15 != (ma_uint8 *)0x0) {
                  memcpy(pmVar15,_cueHeaderSectionData + 0x15a,0x40);
                }
                ma_dr_wav_buffer_reader_read_u16
                          ((ma_dr_wav_buffer_reader *)cueHeaderSectionData,
                           &(pmVar12->data).bext.loudnessValue);
                ma_dr_wav_buffer_reader_read_u16
                          ((ma_dr_wav_buffer_reader *)cueHeaderSectionData,
                           &(pmVar12->data).bext.loudnessRange);
                ma_dr_wav_buffer_reader_read_u16
                          ((ma_dr_wav_buffer_reader *)cueHeaderSectionData,
                           &(pmVar12->data).bext.maxTruePeakLevel);
                ma_dr_wav_buffer_reader_read_u16
                          ((ma_dr_wav_buffer_reader *)cueHeaderSectionData,
                           &(pmVar12->data).bext.maxMomentaryLoudness);
                ma_dr_wav_buffer_reader_read_u16
                          ((ma_dr_wav_buffer_reader *)cueHeaderSectionData,
                           &(pmVar12->data).bext.maxShortTermLoudness);
                if (uVar11 - 0x25a == 0) {
                  (pmVar12->data).bext.pCodingHistory = (char *)0x0;
                  sVar5 = 0x25a;
                  mVar4 = 0;
                }
                else {
                  pmVar15 = pParser->pDataCursor;
                  pParser->pDataCursor = pmVar15 + (uVar11 - 0x259);
                  (pmVar12->data).bext.pCodingHistory = (char *)pmVar15;
                  sVar5 = (*pParser->onRead)(pParser->pReadSeekUserData,pmVar15,uVar11 - 0x25a);
                  sVar5 = sVar5 + 0x25a;
                  sVar6 = ma_dr_wav__strlen((pmVar12->data).bext.pCodingHistory);
                  mVar4 = (ma_uint32)sVar6;
                }
                (pmVar12->data).bext.codingHistorySize = mVar4;
              }
              if (sVar5 == pChunkHeader->sizeInBytes) {
                pParser->metadataCursor = pParser->metadataCursor + 1;
                return sVar5;
              }
              return sVar5;
            }
            local_198[0] = '\0';
            sVar5 = (*pParser->onRead)(pParser->pReadSeekUserData,smplHeaderData,0x100);
            if (sVar5 != 0x100) {
              return sVar5;
            }
            sVar5 = ma_dr_wav__strlen((char *)smplHeaderData);
            smplHeaderData._32_4_ = smplHeaderData._32_4_ & 0xffffff00;
            sVar6 = (*pParser->onRead)(pParser->pReadSeekUserData,smplHeaderData,0x20);
            if (sVar6 == 0x20) {
              sVar9 = ma_dr_wav__strlen((char *)smplHeaderData);
              smplHeaderData._32_4_ = smplHeaderData._32_4_ & 0xffffff00;
              sVar10 = (*pParser->onRead)(pParser->pReadSeekUserData,smplHeaderData,0x20);
              mVar16 = sVar6 + 0x100 + sVar10;
              if (sVar10 == 0x20) {
                sVar6 = ma_dr_wav__strlen((char *)smplHeaderData);
                pParser->extraCapacity =
                     (pParser->extraCapacity + sVar5 + sVar9 + sVar6 + pChunkHeader->sizeInBytes) -
                     0x217;
                pParser->metadataCount = pParser->metadataCount + 1;
                return mVar16;
              }
              return mVar16;
            }
            return sVar6 + 0x100;
          }
          mVar2 = ma_dr_wav_fourcc_equal((ma_uint8 *)pChunkHeader,"LIST");
          if ((mVar2 == 0) &&
             (mVar2 = ma_dr_wav_fourcc_equal((ma_uint8 *)pChunkHeader,"list"), mVar2 == 0)) {
            mVar16 = ma_dr_wav__metadata_process_unknown_chunk
                               (pParser,(ma_uint8 *)pChunkHeader,pChunkHeader->sizeInBytes,
                                ma_dr_wav_metadata_location_top_level);
            return mVar16;
          }
          mVar16 = 0;
          location = ma_dr_wav_metadata_location_invalid;
          do {
            while( true ) {
              while( true ) {
                if (pChunkHeader->sizeInBytes <= mVar16) {
                  return mVar16;
                }
                sVar5 = (*pParser->onRead)(pParser->pReadSeekUserData,cueHeaderSectionData,4);
                mVar16 = mVar16 + sVar5;
                if (sVar5 != 4) {
                  return mVar16;
                }
                mVar2 = ma_dr_wav_fourcc_equal(cueHeaderSectionData,"adtl");
                if (mVar2 == 0) break;
                location = ma_dr_wav_metadata_location_inside_adtl_list;
              }
              mVar2 = ma_dr_wav_fourcc_equal(cueHeaderSectionData,"INFO");
              if (mVar2 == 0) break;
              location = ma_dr_wav_metadata_location_inside_info_list;
            }
            sVar5 = (*pParser->onRead)(pParser->pReadSeekUserData,subchunkSizeBuffer,4);
            amVar1 = subchunkSizeBuffer;
            mVar7 = mVar16 + sVar5;
            if (sVar5 != 4) {
              return mVar7;
            }
            uVar11 = (ulong)(uint)subchunkSizeBuffer;
            mVar2 = ma_dr_wav_fourcc_equal(cueHeaderSectionData,"labl");
            if ((mVar2 == 0) &&
               (mVar2 = ma_dr_wav_fourcc_equal(cueHeaderSectionData,"note"), mVar2 == 0)) {
              mVar2 = ma_dr_wav_fourcc_equal(cueHeaderSectionData,"ltxt");
              if (mVar2 == 0) {
                mVar2 = ma_dr_wav_fourcc_equal(cueHeaderSectionData,"ISFT");
                if (mVar2 == 0) {
                  mVar2 = ma_dr_wav_fourcc_equal(cueHeaderSectionData,"ICOP");
                  if (mVar2 == 0) {
                    mVar2 = ma_dr_wav_fourcc_equal(cueHeaderSectionData,"INAM");
                    if (mVar2 == 0) {
                      mVar2 = ma_dr_wav_fourcc_equal(cueHeaderSectionData,"IART");
                      if (mVar2 == 0) {
                        mVar2 = ma_dr_wav_fourcc_equal(cueHeaderSectionData,"ICMT");
                        if (mVar2 == 0) {
                          mVar2 = ma_dr_wav_fourcc_equal(cueHeaderSectionData,"ICRD");
                          if (mVar2 == 0) {
                            mVar2 = ma_dr_wav_fourcc_equal(cueHeaderSectionData,"IGNR");
                            if (mVar2 == 0) {
                              mVar2 = ma_dr_wav_fourcc_equal(cueHeaderSectionData,"IPRD");
                              if (mVar2 == 0) {
                                mVar2 = ma_dr_wav_fourcc_equal(cueHeaderSectionData,"ITRK");
                                if (mVar2 == 0) {
                                  sVar5 = ma_dr_wav__metadata_process_unknown_chunk
                                                    (pParser,cueHeaderSectionData,uVar11,location);
                                  goto LAB_0017a580;
                                }
                                type = ma_dr_wav_metadata_type_list_info_tracknumber;
                              }
                              else {
                                type = ma_dr_wav_metadata_type_list_info_album;
                              }
                            }
                            else {
                              type = ma_dr_wav_metadata_type_list_info_genre;
                            }
                          }
                          else {
                            type = ma_dr_wav_metadata_type_list_info_date;
                          }
                        }
                        else {
                          type = ma_dr_wav_metadata_type_list_info_comment;
                        }
                      }
                      else {
                        type = ma_dr_wav_metadata_type_list_info_artist;
                      }
                    }
                    else {
                      type = ma_dr_wav_metadata_type_list_info_title;
                    }
                  }
                  else {
                    type = ma_dr_wav_metadata_type_list_info_copyright;
                  }
                }
                else {
                  type = ma_dr_wav_metadata_type_list_info_software;
                }
                sVar5 = ma_dr_wav__metadata_process_info_text_chunk(pParser,uVar11,type);
              }
              else {
                if (0x13 < (uint)amVar1) {
                  if (pParser->stage != ma_dr_wav__metadata_parser_stage_count) {
                    pmVar12 = pParser->pMetadata + pParser->metadataCursor;
                    sVar5 = (*pParser->onRead)(pParser->pReadSeekUserData,smplHeaderData,0x14);
                    if (sVar5 == 0x14) {
                      pmVar12->type = ma_dr_wav_metadata_type_list_labelled_cue_region;
                      (pmVar12->data).cue.cuePointCount = smplHeaderData._0_4_;
                      (pmVar12->data).smpl.productId = smplHeaderData._4_4_;
                      (pmVar12->data).labelledCueRegion.purposeId[0] = smplHeaderData[8];
                      (pmVar12->data).labelledCueRegion.purposeId[1] = smplHeaderData[9];
                      (pmVar12->data).labelledCueRegion.purposeId[2] = smplHeaderData[10];
                      (pmVar12->data).labelledCueRegion.purposeId[3] = smplHeaderData[0xb];
                      (pmVar12->data).labelledCueRegion.country = smplHeaderData._12_2_;
                      (pmVar12->data).labelledCueRegion.language = smplHeaderData._14_2_;
                      (pmVar12->data).acid.meterDenominator = smplHeaderData._16_2_;
                      (pmVar12->data).acid.meterNumerator = smplHeaderData._18_2_;
                      uVar3 = (int)amVar1 - 0x14;
                      if (uVar3 == 0) {
                        (pmVar12->data).smpl.smpteFormat = 0;
                        (pmVar12->data).labelledCueRegion.pString = (char *)0x0;
                        sVar5 = 0x14;
                      }
                      else {
                        (pmVar12->data).smpl.smpteFormat = (int)amVar1 - 0x15;
                        pmVar15 = pParser->pDataCursor;
                        pParser->pDataCursor = pmVar15 + uVar3;
                        (pmVar12->data).labelledCueRegion.pString = (char *)pmVar15;
                        sVar5 = (*pParser->onRead)(pParser->pReadSeekUserData,pmVar15,(ulong)uVar3);
                        sVar5 = sVar5 + 0x14;
                      }
                    }
                    if (sVar5 == uVar11) goto LAB_0017a533;
                    goto LAB_0017a580;
                  }
                  pParser->metadataCount = pParser->metadataCount + 1;
                  pParser->extraCapacity = (pParser->extraCapacity + uVar11) - 0x14;
                }
LAB_0017a57e:
                sVar5 = 0;
              }
              goto LAB_0017a580;
            }
            if ((uint)amVar1 < 4) goto LAB_0017a57e;
            if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
              pParser->metadataCount = pParser->metadataCount + 1;
              pParser->extraCapacity = (pParser->extraCapacity + uVar11) - 4;
              sVar5 = 0;
LAB_0017a580:
              mVar16 = sVar5 + mVar7;
              if (sVar5 < uVar11) {
                mVar2 = (*pParser->onSeek)(pParser->pReadSeekUserData,(int)amVar1 - (int)sVar5,
                                           ma_dr_wav_seek_origin_current);
                if (mVar2 == 0) {
                  return mVar16;
                }
                mVar16 = mVar7 + uVar11;
              }
            }
            else {
              pmVar12 = pParser->pMetadata + pParser->metadataCursor;
              mVar2 = ma_dr_wav_fourcc_equal(cueHeaderSectionData,"labl");
              sVar5 = (*pParser->onRead)(pParser->pReadSeekUserData,smplHeaderData,4);
              if (sVar5 == 4) {
                pmVar12->type = (uint)(mVar2 == 0) * 0x40 + ma_dr_wav_metadata_type_list_label;
                (pmVar12->data).cue.cuePointCount = smplHeaderData._0_4_;
                uVar3 = (int)amVar1 - 4;
                if (uVar3 == 0) {
                  (pmVar12->data).smpl.productId = 0;
                  (pmVar12->data).cue.pCuePoints = (ma_dr_wav_cue_point *)0x0;
                  sVar5 = 4;
                }
                else {
                  (pmVar12->data).smpl.productId = (int)amVar1 - 5;
                  pmVar15 = pParser->pDataCursor;
                  pParser->pDataCursor = pmVar15 + uVar3;
                  (pmVar12->data).bext.pOriginatorName = (char *)pmVar15;
                  sVar5 = (*pParser->onRead)(pParser->pReadSeekUserData,pmVar15,(ulong)uVar3);
                  sVar5 = sVar5 + 4;
                }
              }
              if (sVar5 != uVar11) goto LAB_0017a580;
LAB_0017a533:
              pParser->metadataCursor = pParser->metadataCursor + 1;
              mVar16 = mVar7 + uVar11;
            }
            if (((uint)amVar1 & 1) != 0) {
              mVar2 = (*pParser->onSeek)(pParser->pReadSeekUserData,1,ma_dr_wav_seek_origin_current)
              ;
              if (mVar2 == 0) {
                return mVar16;
              }
              mVar16 = mVar16 + 1;
            }
          } while( true );
        }
        uVar11 = pChunkHeader->sizeInBytes;
        if (uVar11 < 4) {
          return 0;
        }
        if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
          pParser->metadataCount = pParser->metadataCount + 1;
          mVar16 = 0;
          mVar7 = pParser->extraCapacity + ~((uVar11 - 4) % 0x18) + uVar11 + 4;
          goto LAB_0017a74d;
        }
        pmVar12 = pParser->pMetadata;
        if (pmVar12 == (ma_dr_wav_metadata *)0x0) goto LAB_0017a082;
        mVar16 = pParser->metadataCursor;
        sVar5 = (*pParser->onRead)(pParser->pReadSeekUserData,cueHeaderSectionData,4);
        if (sVar5 == 4) {
          pmVar12 = pmVar12 + mVar16;
          pmVar12->type = ma_dr_wav_metadata_type_cue;
          *&(pmVar12->data).unknown.id = cueHeaderSectionData;
          sVar5 = 4;
          if ((pChunkHeader->sizeInBytes - 4) / 0x18 == ((ulong)_cueHeaderSectionData & 0xffffffff))
          {
            uVar11 = (ulong)((uint)pParser->pDataCursor & 7);
            lVar13 = 8 - uVar11;
            if (uVar11 == 0) {
              lVar13 = 0;
            }
            pmVar15 = pParser->pDataCursor + lVar13;
            pParser->pDataCursor = pmVar15 + ((ulong)_cueHeaderSectionData & 0xffffffff) * 0x18;
            (pmVar12->data).bext.pOriginatorName = (char *)pmVar15;
            uVar3 = (pmVar12->data).cue.cuePointCount;
            if (uVar3 != 0) {
              sVar5 = 4;
              lVar13 = 0;
              for (uVar11 = 0; uVar11 < uVar3; uVar11 = uVar11 + 1) {
                sVar6 = (*pParser->onRead)(pParser->pReadSeekUserData,smplHeaderData,0x18);
                sVar5 = sVar5 + sVar6;
                if (sVar6 != 0x18) break;
                *(undefined4 *)(((pmVar12->data).cue.pCuePoints)->dataChunkId + lVar13 + -8) =
                     smplHeaderData._0_4_;
                *(undefined4 *)(((pmVar12->data).cue.pCuePoints)->dataChunkId + lVar13 + -4) =
                     smplHeaderData._4_4_;
                ((pmVar12->data).cue.pCuePoints)->dataChunkId[lVar13] = smplHeaderData[8];
                ((pmVar12->data).cue.pCuePoints)->dataChunkId[lVar13 + 1] = smplHeaderData[9];
                ((pmVar12->data).cue.pCuePoints)->dataChunkId[lVar13 + 2] = smplHeaderData[10];
                ((pmVar12->data).cue.pCuePoints)->dataChunkId[lVar13 + 3] = smplHeaderData[0xb];
                *(undefined4 *)(((pmVar12->data).cue.pCuePoints)->dataChunkId + lVar13 + 4) =
                     smplHeaderData._12_4_;
                *(undefined4 *)(((pmVar12->data).cue.pCuePoints)->dataChunkId + lVar13 + 8) =
                     smplHeaderData._16_4_;
                *(undefined4 *)(((pmVar12->data).cue.pCuePoints)->dataChunkId + lVar13 + 0xc) =
                     smplHeaderData._20_4_;
                uVar3 = (pmVar12->data).cue.cuePointCount;
                lVar13 = lVar13 + 0x18;
              }
            }
          }
        }
        goto LAB_0017a0c1;
      }
      if (pChunkHeader->sizeInBytes != 0x18) {
        return 0;
      }
      if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) goto LAB_00179ef9;
      pmVar12 = pParser->pMetadata;
      if (pmVar12 == (ma_dr_wav_metadata *)0x0) goto LAB_0017a087;
      mVar16 = pParser->metadataCursor;
      sVar5 = (*pParser->onRead)(pParser->pReadSeekUserData,smplHeaderData,0x18);
      if (sVar5 == 0x18) {
        pmVar12 = pmVar12 + mVar16;
        pmVar12->type = ma_dr_wav_metadata_type_acid;
        (pmVar12->data).cue.cuePointCount = smplHeaderData._0_4_;
        (pmVar12->data).acid.midiUnityNote = smplHeaderData._4_2_;
        (pmVar12->data).acid.reserved1 = smplHeaderData._6_2_;
        (pmVar12->data).smpl.samplePeriodNanoseconds = smplHeaderData._8_4_;
        (pmVar12->data).smpl.midiUnityNote = smplHeaderData._12_4_;
        (pmVar12->data).acid.meterDenominator = smplHeaderData._16_2_;
        (pmVar12->data).acid.meterNumerator = smplHeaderData._18_2_;
        (pmVar12->data).smpl.smpteFormat = smplHeaderData._20_4_;
        sVar5 = 0x18;
      }
    }
    else {
      if (pChunkHeader->sizeInBytes != 7) {
        return 0;
      }
      if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
LAB_00179ef9:
        pParser->metadataCount = pParser->metadataCount + 1;
        return 0;
      }
      pmVar12 = pParser->pMetadata;
      if (pmVar12 == (ma_dr_wav_metadata *)0x0) {
LAB_0017a087:
        sVar5 = 0;
      }
      else {
        mVar16 = pParser->metadataCursor;
        sVar5 = (*pParser->onRead)(pParser->pReadSeekUserData,smplHeaderData,7);
        if (sVar5 == 7) {
          pmVar12 = pmVar12 + mVar16;
          pmVar12->type = ma_dr_wav_metadata_type_inst;
          (pmVar12->data).unknown.id[0] = smplHeaderData[0];
          (pmVar12->data).unknown.id[1] = smplHeaderData[1];
          (pmVar12->data).unknown.id[2] = smplHeaderData[2];
          (pmVar12->data).unknown.id[3] = smplHeaderData[3];
          (pmVar12->data).inst.highNote = smplHeaderData[4];
          (pmVar12->data).inst.lowVelocity = smplHeaderData[5];
          (pmVar12->data).inst.highVelocity = smplHeaderData[6];
          sVar5 = 7;
        }
      }
    }
    if (sVar5 != pChunkHeader->sizeInBytes) {
      return sVar5;
    }
  }
  else {
    if (pChunkHeader->sizeInBytes < 0x24) {
      return 0;
    }
    if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
      mVar2 = (*pParser->onSeek)(pParser->pReadSeekUserData,0x1c,ma_dr_wav_seek_origin_current);
      if (mVar2 == 0) {
        return 0;
      }
      sVar5 = (*pParser->onRead)(pParser->pReadSeekUserData,smplHeaderData,4);
      if (sVar5 != 4) {
        return sVar5 + 0x1c;
      }
      uVar11 = (pChunkHeader->sizeInBytes - 0x24) / 0x18;
      if (uVar11 != (uint)smplHeaderData._0_4_) {
        return 0x20;
      }
      sVar6 = (*pParser->onRead)(pParser->pReadSeekUserData,smplHeaderData,4);
      mVar16 = sVar5 + 0x1c + sVar6;
      if (sVar6 != 4) {
        return mVar16;
      }
      pParser->metadataCount = pParser->metadataCount + 1;
      mVar7 = pParser->extraCapacity + uVar11 * 0x18 + (ulong)(uint)smplHeaderData._0_4_ + 7;
LAB_0017a74d:
      pParser->extraCapacity = mVar7;
      return mVar16;
    }
    pmVar12 = pParser->pMetadata;
    if (pmVar12 == (ma_dr_wav_metadata *)0x0) {
LAB_0017a082:
      sVar5 = 0;
    }
    else {
      mVar16 = pParser->metadataCursor;
      sVar5 = (*pParser->onRead)(pParser->pReadSeekUserData,smplHeaderData,0x24);
      if (sVar5 == 0x24) {
        pmVar12 = pmVar12 + mVar16;
        pmVar12->type = ma_dr_wav_metadata_type_smpl;
        (pmVar12->data).cue.cuePointCount = smplHeaderData._0_4_;
        (pmVar12->data).smpl.productId = smplHeaderData._4_4_;
        (pmVar12->data).smpl.samplePeriodNanoseconds = smplHeaderData._8_4_;
        (pmVar12->data).smpl.midiUnityNote = smplHeaderData._12_4_;
        (pmVar12->data).smpl.midiPitchFraction = smplHeaderData._16_4_;
        (pmVar12->data).smpl.smpteFormat = smplHeaderData._20_4_;
        (pmVar12->data).smpl.smpteOffset = smplHeaderData._24_4_;
        (pmVar12->data).smpl.sampleLoopCount = smplHeaderData._28_4_;
        (pmVar12->data).smpl.samplerSpecificDataSizeInBytes = smplHeaderData._32_4_;
        sVar5 = 0x24;
        if ((pChunkHeader->sizeInBytes - 0x24) / 0x18 == (ulong)(uint)smplHeaderData._28_4_) {
          uVar11 = (ulong)((uint)pParser->pDataCursor & 7);
          lVar13 = 8 - uVar11;
          if (uVar11 == 0) {
            lVar13 = 0;
          }
          pmVar14 = (ma_dr_wav_smpl_loop *)(pParser->pDataCursor + lVar13);
          pParser->pDataCursor = (ma_uint8 *)(pmVar14 + (uint)smplHeaderData._28_4_);
          (pmVar12->data).smpl.pLoops = pmVar14;
          sVar5 = 0x24;
          lVar13 = 0;
          for (uVar11 = 0; uVar11 < (pmVar12->data).smpl.sampleLoopCount; uVar11 = uVar11 + 1) {
            sVar6 = (*pParser->onRead)(pParser->pReadSeekUserData,cueHeaderSectionData,0x18);
            sVar5 = sVar5 + sVar6;
            if (sVar6 != 0x18) break;
            *(ma_uint8 (*) [4])((long)&((pmVar12->data).smpl.pLoops)->cuePointId + lVar13) =
                 cueHeaderSectionData;
            *(undefined4 *)((long)&((pmVar12->data).smpl.pLoops)->type + lVar13) = uStack_2b4;
            *(undefined4 *)((long)&((pmVar12->data).smpl.pLoops)->firstSampleByteOffset + lVar13) =
                 local_2b0;
            *(undefined4 *)((long)&((pmVar12->data).smpl.pLoops)->lastSampleByteOffset + lVar13) =
                 uStack_2ac;
            *(undefined4 *)((long)&((pmVar12->data).smpl.pLoops)->sampleFraction + lVar13) =
                 local_2a8;
            *(undefined4 *)((long)&((pmVar12->data).smpl.pLoops)->playCount + lVar13) = uStack_2a4;
            lVar13 = lVar13 + 0x18;
          }
          uVar11 = (ulong)(pmVar12->data).smpl.samplerSpecificDataSizeInBytes;
          if (uVar11 != 0) {
            pmVar15 = pParser->pDataCursor;
            pParser->pDataCursor = pmVar15 + uVar11;
            (pmVar12->data).smpl.pSamplerSpecificData = pmVar15;
            sVar6 = (*pParser->onRead)(pParser->pReadSeekUserData,pmVar15,
                                       (ulong)(pmVar12->data).smpl.samplerSpecificDataSizeInBytes);
            sVar5 = sVar5 + sVar6;
          }
        }
      }
    }
LAB_0017a0c1:
    if (sVar5 != pChunkHeader->sizeInBytes) {
      return sVar5;
    }
  }
  pParser->metadataCursor = pParser->metadataCursor + 1;
  return sVar5;
}

Assistant:

MA_PRIVATE ma_uint64 ma_dr_wav__metadata_process_chunk(ma_dr_wav__metadata_parser* pParser, const ma_dr_wav_chunk_header* pChunkHeader, ma_dr_wav_metadata_type allowedMetadataTypes)
{
    const ma_uint8 *pChunkID = pChunkHeader->id.fourcc;
    ma_uint64 bytesRead = 0;
    if (ma_dr_wav__chunk_matches(allowedMetadataTypes, pChunkID, ma_dr_wav_metadata_type_smpl, "smpl")) {
        if (pChunkHeader->sizeInBytes >= MA_DR_WAV_SMPL_BYTES) {
            if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
                ma_uint8 buffer[4];
                size_t bytesJustRead;
                if (!pParser->onSeek(pParser->pReadSeekUserData, 28, ma_dr_wav_seek_origin_current)) {
                    return bytesRead;
                }
                bytesRead += 28;
                bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, buffer, sizeof(buffer), &bytesRead);
                if (bytesJustRead == sizeof(buffer)) {
                    ma_uint32 loopCount = ma_dr_wav_bytes_to_u32(buffer);
                    ma_uint64 calculatedLoopCount;
                    calculatedLoopCount = (pChunkHeader->sizeInBytes - MA_DR_WAV_SMPL_BYTES) / MA_DR_WAV_SMPL_LOOP_BYTES;
                    if (calculatedLoopCount == loopCount) {
                        bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, buffer, sizeof(buffer), &bytesRead);
                        if (bytesJustRead == sizeof(buffer)) {
                            ma_uint32 samplerSpecificDataSizeInBytes = ma_dr_wav_bytes_to_u32(buffer);
                            pParser->metadataCount += 1;
                            ma_dr_wav__metadata_request_extra_memory_for_stage_2(pParser, sizeof(ma_dr_wav_smpl_loop) * loopCount, MA_DR_WAV_METADATA_ALIGNMENT);
                            ma_dr_wav__metadata_request_extra_memory_for_stage_2(pParser, samplerSpecificDataSizeInBytes, 1);
                        }
                    } else {
                    }
                }
            } else {
                bytesRead = ma_dr_wav__read_smpl_to_metadata_obj(pParser, pChunkHeader, &pParser->pMetadata[pParser->metadataCursor]);
                if (bytesRead == pChunkHeader->sizeInBytes) {
                    pParser->metadataCursor += 1;
                } else {
                }
            }
        } else {
        }
    } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, pChunkID, ma_dr_wav_metadata_type_inst, "inst")) {
        if (pChunkHeader->sizeInBytes == MA_DR_WAV_INST_BYTES) {
            if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
                pParser->metadataCount += 1;
            } else {
                bytesRead = ma_dr_wav__read_inst_to_metadata_obj(pParser, &pParser->pMetadata[pParser->metadataCursor]);
                if (bytesRead == pChunkHeader->sizeInBytes) {
                    pParser->metadataCursor += 1;
                } else {
                }
            }
        } else {
        }
    } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, pChunkID, ma_dr_wav_metadata_type_acid, "acid")) {
        if (pChunkHeader->sizeInBytes == MA_DR_WAV_ACID_BYTES) {
            if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
                pParser->metadataCount += 1;
            } else {
                bytesRead = ma_dr_wav__read_acid_to_metadata_obj(pParser, &pParser->pMetadata[pParser->metadataCursor]);
                if (bytesRead == pChunkHeader->sizeInBytes) {
                    pParser->metadataCursor += 1;
                } else {
                }
            }
        } else {
        }
    } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, pChunkID, ma_dr_wav_metadata_type_cue, "cue ")) {
        if (pChunkHeader->sizeInBytes >= MA_DR_WAV_CUE_BYTES) {
            if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
                size_t cueCount;
                pParser->metadataCount += 1;
                cueCount = (size_t)(pChunkHeader->sizeInBytes - MA_DR_WAV_CUE_BYTES) / MA_DR_WAV_CUE_POINT_BYTES;
                ma_dr_wav__metadata_request_extra_memory_for_stage_2(pParser, sizeof(ma_dr_wav_cue_point) * cueCount, MA_DR_WAV_METADATA_ALIGNMENT);
            } else {
                bytesRead = ma_dr_wav__read_cue_to_metadata_obj(pParser, pChunkHeader, &pParser->pMetadata[pParser->metadataCursor]);
                if (bytesRead == pChunkHeader->sizeInBytes) {
                    pParser->metadataCursor += 1;
                } else {
                }
            }
        } else {
        }
    } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, pChunkID, ma_dr_wav_metadata_type_bext, "bext")) {
        if (pChunkHeader->sizeInBytes >= MA_DR_WAV_BEXT_BYTES) {
            if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
                char buffer[MA_DR_WAV_BEXT_DESCRIPTION_BYTES + 1];
                size_t allocSizeNeeded = MA_DR_WAV_BEXT_UMID_BYTES;
                size_t bytesJustRead;
                buffer[MA_DR_WAV_BEXT_DESCRIPTION_BYTES] = '\0';
                bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, buffer, MA_DR_WAV_BEXT_DESCRIPTION_BYTES, &bytesRead);
                if (bytesJustRead != MA_DR_WAV_BEXT_DESCRIPTION_BYTES) {
                    return bytesRead;
                }
                allocSizeNeeded += ma_dr_wav__strlen(buffer) + 1;
                buffer[MA_DR_WAV_BEXT_ORIGINATOR_NAME_BYTES] = '\0';
                bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, buffer, MA_DR_WAV_BEXT_ORIGINATOR_NAME_BYTES, &bytesRead);
                if (bytesJustRead != MA_DR_WAV_BEXT_ORIGINATOR_NAME_BYTES) {
                    return bytesRead;
                }
                allocSizeNeeded += ma_dr_wav__strlen(buffer) + 1;
                buffer[MA_DR_WAV_BEXT_ORIGINATOR_REF_BYTES] = '\0';
                bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, buffer, MA_DR_WAV_BEXT_ORIGINATOR_REF_BYTES, &bytesRead);
                if (bytesJustRead != MA_DR_WAV_BEXT_ORIGINATOR_REF_BYTES) {
                    return bytesRead;
                }
                allocSizeNeeded += ma_dr_wav__strlen(buffer) + 1;
                allocSizeNeeded += (size_t)pChunkHeader->sizeInBytes - MA_DR_WAV_BEXT_BYTES;
                ma_dr_wav__metadata_request_extra_memory_for_stage_2(pParser, allocSizeNeeded, 1);
                pParser->metadataCount += 1;
            } else {
                bytesRead = ma_dr_wav__read_bext_to_metadata_obj(pParser, &pParser->pMetadata[pParser->metadataCursor], pChunkHeader->sizeInBytes);
                if (bytesRead == pChunkHeader->sizeInBytes) {
                    pParser->metadataCursor += 1;
                } else {
                }
            }
        } else {
        }
    } else if (ma_dr_wav_fourcc_equal(pChunkID, "LIST") || ma_dr_wav_fourcc_equal(pChunkID, "list")) {
        ma_dr_wav_metadata_location listType = ma_dr_wav_metadata_location_invalid;
        while (bytesRead < pChunkHeader->sizeInBytes) {
            ma_uint8 subchunkId[4];
            ma_uint8 subchunkSizeBuffer[4];
            ma_uint64 subchunkDataSize;
            ma_uint64 subchunkBytesRead = 0;
            ma_uint64 bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, subchunkId, sizeof(subchunkId), &bytesRead);
            if (bytesJustRead != sizeof(subchunkId)) {
                break;
            }
            if (ma_dr_wav_fourcc_equal(subchunkId, "adtl")) {
                listType = ma_dr_wav_metadata_location_inside_adtl_list;
                continue;
            } else if (ma_dr_wav_fourcc_equal(subchunkId, "INFO")) {
                listType = ma_dr_wav_metadata_location_inside_info_list;
                continue;
            }
            bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, subchunkSizeBuffer, sizeof(subchunkSizeBuffer), &bytesRead);
            if (bytesJustRead != sizeof(subchunkSizeBuffer)) {
                break;
            }
            subchunkDataSize = ma_dr_wav_bytes_to_u32(subchunkSizeBuffer);
            if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_label, "labl") || ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_note, "note")) {
                if (subchunkDataSize >= MA_DR_WAV_LIST_LABEL_OR_NOTE_BYTES) {
                    ma_uint64 stringSizeWithNullTerm = subchunkDataSize - MA_DR_WAV_LIST_LABEL_OR_NOTE_BYTES;
                    if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
                        pParser->metadataCount += 1;
                        ma_dr_wav__metadata_request_extra_memory_for_stage_2(pParser, (size_t)stringSizeWithNullTerm, 1);
                    } else {
                        subchunkBytesRead = ma_dr_wav__read_list_label_or_note_to_metadata_obj(pParser, &pParser->pMetadata[pParser->metadataCursor], subchunkDataSize, ma_dr_wav_fourcc_equal(subchunkId, "labl") ? ma_dr_wav_metadata_type_list_label : ma_dr_wav_metadata_type_list_note);
                        if (subchunkBytesRead == subchunkDataSize) {
                            pParser->metadataCursor += 1;
                        } else {
                        }
                    }
                } else {
                }
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_labelled_cue_region, "ltxt")) {
                if (subchunkDataSize >= MA_DR_WAV_LIST_LABELLED_TEXT_BYTES) {
                    ma_uint64 stringSizeWithNullTerminator = subchunkDataSize - MA_DR_WAV_LIST_LABELLED_TEXT_BYTES;
                    if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
                        pParser->metadataCount += 1;
                        ma_dr_wav__metadata_request_extra_memory_for_stage_2(pParser, (size_t)stringSizeWithNullTerminator, 1);
                    } else {
                        subchunkBytesRead = ma_dr_wav__read_list_labelled_cue_region_to_metadata_obj(pParser, &pParser->pMetadata[pParser->metadataCursor], subchunkDataSize);
                        if (subchunkBytesRead == subchunkDataSize) {
                            pParser->metadataCursor += 1;
                        } else {
                        }
                    }
                } else {
                }
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_software, "ISFT")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_software);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_copyright, "ICOP")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_copyright);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_title, "INAM")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_title);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_artist, "IART")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_artist);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_comment, "ICMT")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_comment);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_date, "ICRD")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_date);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_genre, "IGNR")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_genre);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_album, "IPRD")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_album);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_tracknumber, "ITRK")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_tracknumber);
            } else if ((allowedMetadataTypes & ma_dr_wav_metadata_type_unknown) != 0) {
                subchunkBytesRead = ma_dr_wav__metadata_process_unknown_chunk(pParser, subchunkId, subchunkDataSize, listType);
            }
            bytesRead += subchunkBytesRead;
            MA_DR_WAV_ASSERT(subchunkBytesRead <= subchunkDataSize);
            if (subchunkBytesRead < subchunkDataSize) {
                ma_uint64 bytesToSeek = subchunkDataSize - subchunkBytesRead;
                if (!pParser->onSeek(pParser->pReadSeekUserData, (int)bytesToSeek, ma_dr_wav_seek_origin_current)) {
                    break;
                }
                bytesRead += bytesToSeek;
            }
            if ((subchunkDataSize % 2) == 1) {
                if (!pParser->onSeek(pParser->pReadSeekUserData, 1, ma_dr_wav_seek_origin_current)) {
                    break;
                }
                bytesRead += 1;
            }
        }
    } else if ((allowedMetadataTypes & ma_dr_wav_metadata_type_unknown) != 0) {
        bytesRead = ma_dr_wav__metadata_process_unknown_chunk(pParser, pChunkID, pChunkHeader->sizeInBytes, ma_dr_wav_metadata_location_top_level);
    }
    return bytesRead;
}